

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask whereOmitNoopJoin(WhereInfo *pWInfo,Bitmask notReady)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  Bitmask BVar4;
  long lVar5;
  long *plVar6;
  ulong uVar7;
  ulong in_RSI;
  long in_RDI;
  int nByte;
  Bitmask m1;
  WhereLoop *pLoop;
  SrcItem *pItem;
  WhereTerm *pEnd;
  WhereTerm *pTerm;
  int hasRightJoin;
  Bitmask tabUsed;
  int i;
  ExprList *in_stack_ffffffffffffffb8;
  WhereMaskSet *in_stack_ffffffffffffffc0;
  long *local_30;
  ulong local_20;
  uint local_14;
  ulong local_10;
  
  local_20 = sqlite3WhereExprListUsage(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (*(long *)(in_RDI + 0x10) != 0) {
    BVar4 = sqlite3WhereExprListUsage(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_20 = BVar4 | local_20;
  }
  bVar1 = *(byte *)(*(long *)(in_RDI + 8) + 0x20);
  local_10 = in_RSI;
  local_14 = (uint)*(byte *)(in_RDI + 0x40);
  while (uVar3 = local_14, local_14 = uVar3 - 1, 0 < (int)local_14) {
    lVar2 = *(long *)(in_RDI + (long)(int)local_14 * 0x70 + 0x3b8);
    lVar5 = *(long *)(in_RDI + 8) + 8 + (ulong)*(byte *)(lVar2 + 0x10) * 0x48;
    if (((*(byte *)(lVar5 + 0x18) & 0x18) == 8) &&
       ((((*(ushort *)(in_RDI + 0x3c) & 0x100) != 0 || ((*(uint *)(lVar2 + 0x30) & 0x1000) != 0)) &&
        ((local_20 & *(ulong *)(lVar2 + 8)) == 0)))) {
      plVar6 = (long *)(*(long *)(in_RDI + 0x88) + (long)*(int *)(in_RDI + 0x7c) * 0x38);
      for (local_30 = *(long **)(in_RDI + 0x88);
          ((local_30 < plVar6 &&
           (((local_30[6] & *(ulong *)(lVar2 + 8)) == 0 ||
            (((*(uint *)(*local_30 + 4) & 1) != 0 &&
             (*(int *)(*local_30 + 0x34) == *(int *)(lVar5 + 0x1c))))))) &&
          (((bVar1 & 0x40) == 0 ||
           (((*(uint *)(*local_30 + 4) & 2) == 0 ||
            (*(int *)(*local_30 + 0x34) != *(int *)(lVar5 + 0x1c))))))); local_30 = local_30 + 7) {
      }
      if (plVar6 <= local_30) {
        uVar7 = (1L << ((byte)local_14 & 0x3f)) - 1;
        *(ulong *)(in_RDI + 0x60) =
             uVar7 & *(ulong *)(in_RDI + 0x60) |
             *(ulong *)(in_RDI + 0x60) >> 1 & (uVar7 ^ 0xffffffffffffffff);
        local_10 = (*(ulong *)(lVar2 + 8) ^ 0xffffffffffffffff) & local_10;
        for (local_30 = *(long **)(in_RDI + 0x88); local_30 < plVar6; local_30 = local_30 + 7) {
          if ((local_30[6] & *(ulong *)(lVar2 + 8)) != 0) {
            *(ushort *)((long)local_30 + 0x12) = *(ushort *)((long)local_30 + 0x12) | 4;
          }
        }
        if (local_14 != *(byte *)(in_RDI + 0x40) - 1) {
          memmove((void *)(in_RDI + 0x358 + (long)(int)local_14 * 0x70),
                  (void *)(in_RDI + 0x358 + (long)(int)uVar3 * 0x70),
                  (long)(int)(((*(byte *)(in_RDI + 0x40) - 1) - local_14) * 0x70));
        }
        *(char *)(in_RDI + 0x40) = *(char *)(in_RDI + 0x40) + -1;
      }
    }
  }
  return local_10;
}

Assistant:

static SQLITE_NOINLINE Bitmask whereOmitNoopJoin(
  WhereInfo *pWInfo,
  Bitmask notReady
){
  int i;
  Bitmask tabUsed;
  int hasRightJoin;

  /* Preconditions checked by the caller */
  assert( pWInfo->nLevel>=2 );
  assert( OptimizationEnabled(pWInfo->pParse->db, SQLITE_OmitNoopJoin) );

  /* These two preconditions checked by the caller combine to guarantee
  ** condition (1) of the header comment */
  assert( pWInfo->pResultSet!=0 );
  assert( 0==(pWInfo->wctrlFlags & WHERE_AGG_DISTINCT) );

  tabUsed = sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pResultSet);
  if( pWInfo->pOrderBy ){
    tabUsed |= sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pOrderBy);
  }
  hasRightJoin = (pWInfo->pTabList->a[0].fg.jointype & JT_LTORJ)!=0;
  for(i=pWInfo->nLevel-1; i>=1; i--){
    WhereTerm *pTerm, *pEnd;
    SrcItem *pItem;
    WhereLoop *pLoop;
    Bitmask m1;
    pLoop = pWInfo->a[i].pWLoop;
    pItem = &pWInfo->pTabList->a[pLoop->iTab];
    if( (pItem->fg.jointype & (JT_LEFT|JT_RIGHT))!=JT_LEFT ) continue;
    if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)==0
     && (pLoop->wsFlags & WHERE_ONEROW)==0
    ){
      continue;
    }
    if( (tabUsed & pLoop->maskSelf)!=0 ) continue;
    pEnd = pWInfo->sWC.a + pWInfo->sWC.nTerm;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        if( !ExprHasProperty(pTerm->pExpr, EP_OuterON)
         || pTerm->pExpr->w.iJoin!=pItem->iCursor
        ){
          break;
        }
      }
      if( hasRightJoin
       && ExprHasProperty(pTerm->pExpr, EP_InnerON)
       && NEVER(pTerm->pExpr->w.iJoin==pItem->iCursor)
      ){
        break;  /* restriction (5) */
      }
    }
    if( pTerm<pEnd ) continue;
    WHERETRACE(0xffffffff,("-> omit unused FROM-clause term %c\n",pLoop->cId));
    m1 = MASKBIT(i)-1;
    testcase( ((pWInfo->revMask>>1) & ~m1)!=0 );
    pWInfo->revMask = (m1 & pWInfo->revMask) | ((pWInfo->revMask>>1) & ~m1);
    notReady &= ~pLoop->maskSelf;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        pTerm->wtFlags |= TERM_CODED;
      }
    }
    if( i!=pWInfo->nLevel-1 ){
      int nByte = (pWInfo->nLevel-1-i) * sizeof(WhereLevel);
      memmove(&pWInfo->a[i], &pWInfo->a[i+1], nByte);
    }
    pWInfo->nLevel--;
    assert( pWInfo->nLevel>0 );
  }
  return notReady;
}